

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbyte.hpp
# Opt level: O0

uint32_t vbyte_decode_u32(uint8_t **input)

{
  byte bVar1;
  byte *pbVar2;
  uint8_t c;
  uint32_t shift;
  uint32_t x;
  uint8_t **input_local;
  
  x = 0;
  shift = 0;
  while( true ) {
    pbVar2 = *input;
    *input = pbVar2 + 1;
    bVar1 = *pbVar2;
    x = ((bVar1 & 0x7f) << ((byte)shift & 0x1f)) + x;
    if ((bVar1 & 0x80) == 0) break;
    shift = shift + 7;
  }
  return x;
}

Assistant:

uint32_t vbyte_decode_u32(const uint8_t*& input)
{
    uint32_t x = 0;
    uint32_t shift = 0;
    while (true) {
        uint8_t c = *input++;
        x += ((c & 127) << shift);
        if (!(c & 128)) {
            return x;
        }
        shift += 7;
    }
    return x;
}